

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

TextureFormat sglr::toNonSRGBFormat(TextureFormat *fmt)

{
  ulong uVar1;
  ulong uVar2;
  
  if (fmt->order == sRGBA) {
    uVar1 = (ulong)fmt->type;
    uVar2 = 8;
  }
  else if (fmt->order == sRGB) {
    uVar1 = (ulong)fmt->type;
    uVar2 = 7;
  }
  else {
    uVar2 = (ulong)*fmt & 0xffffffff;
    uVar1 = (ulong)*fmt >> 0x20;
  }
  return (TextureFormat)(uVar1 << 0x20 | uVar2);
}

Assistant:

tcu::TextureFormat toNonSRGBFormat (const tcu::TextureFormat& fmt)
{
	switch (fmt.order)
	{
		case tcu::TextureFormat::sRGB:
			return tcu::TextureFormat(tcu::TextureFormat::RGB,	fmt.type);
		case tcu::TextureFormat::sRGBA:
			return tcu::TextureFormat(tcu::TextureFormat::RGBA,	fmt.type);
		default:
			return fmt;
	}
}